

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void libyuv::YuvPixel10(uint16_t y,uint16_t u,uint16_t v,uint8_t *b,uint8_t *g,uint8_t *r,
                       YuvConstants *yuvconstants)

{
  uint32_t uVar1;
  int *in_RCX;
  undefined2 in_DX;
  undefined2 in_SI;
  undefined2 in_DI;
  int *in_R8;
  undefined1 *in_R9;
  int16_t unaff_retaddr;
  int16_t unaff_retaddr_00;
  int16_t unaff_retaddr_01;
  int r16;
  int g16;
  int b16;
  undefined2 in_stack_fffffffffffffff8;
  
  YuvPixel16(unaff_retaddr_01,unaff_retaddr_00,unaff_retaddr,
             (int *)CONCAT26(in_DI,CONCAT24(in_SI,CONCAT22(in_DX,in_stack_fffffffffffffff8))),in_RCX
             ,in_R8,_g16);
  uVar1 = Clamp(0);
  *(char *)in_RCX = (char)uVar1;
  uVar1 = Clamp(0);
  *(char *)in_R8 = (char)uVar1;
  uVar1 = Clamp(0);
  *in_R9 = (char)uVar1;
  return;
}

Assistant:

static __inline void YuvPixel10(uint16_t y,
                                uint16_t u,
                                uint16_t v,
                                uint8_t* b,
                                uint8_t* g,
                                uint8_t* r,
                                const struct YuvConstants* yuvconstants) {
  int b16;
  int g16;
  int r16;
  YuvPixel16(y, u, v, &b16, &g16, &r16, yuvconstants);
  *b = Clamp(b16 >> 6);
  *g = Clamp(g16 >> 6);
  *r = Clamp(r16 >> 6);
}